

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestCoherency::initTextureContents(TextureViewTestCoherency *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  uchar *puVar4;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x23f1);
  puVar4 = getHorizontalGradientData(this);
  (**(code **)(lVar3 + 0x13b8))
            (0xde1,0,0,0,this->m_texture_width,this->m_texture_height,0x1908,0x1401,puVar4);
  operator_delete__(puVar4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexSubImage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x23fe);
  (**(code **)(lVar3 + 0x710))(0xde1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenerateMipmap() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2402);
  puVar4 = getStaticColorTextureData
                     (this,this->m_static_texture_width,this->m_static_texture_height);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_static_to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x240c);
  (**(code **)(lVar3 + 0x13b8))
            (0xde1,0,0,0,this->m_static_texture_width,this->m_static_texture_height,0x1908,0x1401,
             puVar4);
  operator_delete__(puVar4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexSubImage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x241a);
  return;
}

Assistant:

void TextureViewTestCoherency::initTextureContents()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Make sure parent texture object is bound before we start modifying
	 * the mip-maps */
	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	/* Set up parent texture mip-maps */
	unsigned char* base_mipmap_data_ptr = getHorizontalGradientData();

	gl.texSubImage2D(GL_TEXTURE_2D, 0, /* level */
					 0,				   /* xoffset */
					 0,				   /* yoffset */
					 m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, base_mipmap_data_ptr);

	delete[] base_mipmap_data_ptr;
	base_mipmap_data_ptr = NULL;

	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexSubImage2D() call failed.");

	/* Generate all mip-maps */
	gl.generateMipmap(GL_TEXTURE_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap() call failed.");

	/* Set up static color texture contents. We only need to fill the base mip-map
	 * since the texture's resolution is 1x1.
	 */
	DE_ASSERT(m_static_texture_height == 1 && m_static_texture_width == 1);

	unsigned char* static_texture_data_ptr = getStaticColorTextureData(m_static_texture_width, m_static_texture_height);

	gl.bindTexture(GL_TEXTURE_2D, m_static_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texSubImage2D(GL_TEXTURE_2D, 0, /* level */
					 0,				   /* xoffset */
					 0,				   /* yoffset */
					 m_static_texture_width, m_static_texture_height, GL_RGBA, GL_UNSIGNED_BYTE,
					 static_texture_data_ptr);

	/* Good to release the buffer at this point */
	delete[] static_texture_data_ptr;

	static_texture_data_ptr = DE_NULL;

	/* Was the API call successful? */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexSubImage2D() call failed.");
}